

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O2

bool __thiscall OpenMD::Globals::addFragmentStamp(Globals *this,FragmentStamp *fragStamp)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  iterator iVar2;
  ostream *poVar3;
  OpenMDException *this_00;
  string sStack_1e8;
  string fragStampName;
  ostringstream oss;
  
  pbVar1 = &(fragStamp->Name).data_;
  std::__cxx11::string::string((string *)&fragStampName,(string *)pbVar1);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
          ::find(&(this->fragmentStamps_)._M_t,&fragStampName);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&oss,(string *)&fragStampName);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::FragmentStamp*>>>
                *)&this->fragmentStamps_,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>
                *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&fragStampName);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Globals Error: Fragment Stamp ");
  std::__cxx11::string::string((string *)&sStack_1e8,(string *)pbVar1);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_1e8);
  std::operator<<(poVar3,"appears multiple times\n");
  std::__cxx11::string::~string((string *)&sStack_1e8);
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&sStack_1e8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

bool Globals::addFragmentStamp(FragmentStamp* fragStamp) {
    std::string fragStampName = fragStamp->getName();
    std::map<std::string, FragmentStamp*>::iterator i;
    bool ret = false;
    i        = fragmentStamps_.find(fragStampName);
    if (i == fragmentStamps_.end()) {
      fragmentStamps_.insert(std::map<std::string, FragmentStamp*>::value_type(
          fragStampName, fragStamp));
      ret = true;
    } else {
      std::ostringstream oss;
      oss << "Globals Error: Fragment Stamp " << fragStamp->getName()
          << "appears multiple times\n";
      throw OpenMDException(oss.str());
    }
    return ret;
  }